

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeStringIteratorPrototype
               (DynamicObject *stringIteratorPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  undefined8 in_RAX;
  RuntimeFunction *pRVar2;
  StaticType *type;
  LiteralString *pLVar3;
  uint uVar5;
  ulong uVar4;
  
  uVar5 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,stringIteratorPrototype,mode,2,0);
  this = (((stringIteratorPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptStringIterator::EntryInfo::Next,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x107);
  uVar4 = (ulong)uVar5 << 0x20;
  (*(stringIteratorPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (stringIteratorPrototype,0x107,pRVar2,6,0,0,uVar4);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar3 = LiteralString::New(type,L"String Iterator",0xf,this->recycler);
    (*(stringIteratorPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (stringIteratorPrototype,0x1b,pLVar3,2,0,0,uVar4 & 0xffffffff00000000);
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeStringIteratorPrototype(DynamicObject* stringIteratorPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(stringIteratorPrototype, mode, 2);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterStringIterator
        // so that the update is in sync with profiler

        JavascriptLibrary* library = stringIteratorPrototype->GetLibrary();
        ScriptContext* scriptContext = library->GetScriptContext();
        library->AddFunctionToLibraryObject(stringIteratorPrototype, PropertyIds::next, &JavascriptStringIterator::EntryInfo::Next, 0);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(stringIteratorPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("String Iterator")), PropertyConfigurable);
        }

        return true;
    }